

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O0

size_t __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::add_value(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
            *this,value_type *v)

{
  bool bVar1;
  reference puVar2;
  reference this_00;
  size_t idx_1;
  size_t idx;
  value_type *v_local;
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *this_local;
  
  bVar1 = boost::container::
          vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
          ::empty((vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
                   *)&this->overwritable_values_);
  if (bVar1) {
    this_local = (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                  *)boost::container::
                    vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
                    ::size(&this->container_);
    boost::container::
    vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
    ::push_back(&this->container_,v);
  }
  else {
    puVar2 = boost::container::
             vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
             ::back((vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
                     *)&this->overwritable_values_);
    this_local = (rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                  *)*puVar2;
    boost::container::
    vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
    ::pop_back((vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
                *)&this->overwritable_values_);
    this_00 = boost::container::
              vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
              ::at(&this->container_,(size_type)this_local);
    std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>::operator=(this_00,v);
  }
  return (size_t)this_local;
}

Assistant:

std::size_t add_value(const value_type& v)
    {
        if(overwritable_values_.empty())
        {
            const std::size_t idx = container_.size();
            container_.push_back(v);
            return idx;
        }
        else
        {
            const std::size_t idx = overwritable_values_.back();
            overwritable_values_.pop_back();
            container_.at(idx) = v;
            return idx;
        }
    }